

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall cppnet::SingletonLogger::SingletonLogger(SingletonLogger *this)

{
  __shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_Singleton<cppnet::SingletonLogger>)._vptr_Singleton =
       (_func_int **)&PTR__SingletonLogger_001259b8;
  (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<cppnet::BaseLogger,unsigned_short_const&,unsigned_short_const&>
            ((unsigned_short *)&local_20,&__log_cache_size);
  std::__shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

SingletonLogger::SingletonLogger() {
    _logger = std::make_shared<BaseLogger>(__log_cache_size, __log_block_size);
}